

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppConsole::~ExampleAppConsole(ExampleAppConsole *this)

{
  char **ppcVar1;
  int local_14;
  int i;
  ExampleAppConsole *this_local;
  
  ClearLog(this);
  for (local_14 = 0; local_14 < (this->History).Size; local_14 = local_14 + 1) {
    ppcVar1 = ImVector<char_*>::operator[](&this->History,local_14);
    free(*ppcVar1);
  }
  ImGuiTextFilter::~ImGuiTextFilter(&this->Filter);
  ImVector<char_*>::~ImVector(&this->History);
  ImVector<const_char_*>::~ImVector(&this->Commands);
  ImVector<char_*>::~ImVector(&this->Items);
  return;
}

Assistant:

~ExampleAppConsole()
    {
        ClearLog();
        for (int i = 0; i < History.Size; i++)
            free(History[i]);
    }